

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O2

int __thiscall gmlc::utilities::numeric_conversion<int>(utilities *this,string_view V,int defValue)

{
  int iVar1;
  string_view V_00;
  
  V_00._M_str = (byte *)V._M_len;
  iVar1 = (int)V._M_str;
  if ((this != (utilities *)0x0) && (numCheck[*V_00._M_str] == '\x01')) {
    V_00._M_len = (size_t)this;
    iVar1 = numConv<int>(V_00);
  }
  return iVar1;
}

Assistant:

X numeric_conversion(std::string_view V, const X defValue)
{
    if (nonNumericFirstCharacter(V)) {
        return defValue;
    }
    try {
        return numConv<X>(V);
    }
    catch (const std::invalid_argument&) {
        return defValue;
    }
}